

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::getwalletinfo(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe4a8;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar2;
  allocator<RPCResult> *paVar3;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe4b0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe4d8;
  RPCResult *in_stack_ffffffffffffe4e0;
  RPCResult *in_stack_ffffffffffffe4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe4f0;
  undefined7 in_stack_ffffffffffffe4f8;
  undefined1 in_stack_ffffffffffffe4ff;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffe500;
  undefined7 in_stack_ffffffffffffe508;
  undefined1 in_stack_ffffffffffffe50f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffe510;
  string *in_stack_ffffffffffffe518;
  undefined1 *puVar4;
  RPCResult *in_stack_ffffffffffffe520;
  RPCResult *in_stack_ffffffffffffe528;
  RPCResult *in_stack_ffffffffffffe530;
  undefined1 *local_1ac8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_1770 [36];
  allocator<char> local_174c;
  allocator<char> local_174b;
  allocator<char> local_174a [2];
  pointer local_1748;
  pointer pRStack_1740;
  pointer local_1738;
  allocator<char> local_172a;
  allocator<char> local_1729;
  _Alloc_hider local_1728;
  size_type sStack_1720;
  undefined1 local_1718 [15];
  allocator<char> local_1709;
  _Alloc_hider local_1708;
  size_type sStack_1700;
  undefined1 local_16f8 [15];
  allocator<char> local_16e9;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  allocator<char> local_16cb;
  allocator<char> local_16ca;
  undefined1 local_16c9 [9];
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined1 local_16aa;
  undefined1 local_16a9 [9];
  undefined8 uStack_16a0;
  undefined8 local_1698;
  allocator<char> local_168a;
  allocator<char> local_1689 [31];
  allocator<char> local_166a;
  allocator<char> local_1669;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  allocator<char> local_164a;
  allocator<char> local_1649;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  allocator<char> local_162a;
  allocator<char> local_1629;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  allocator<char> local_160a;
  allocator<char> local_1609;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  allocator<char> local_15e9;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  allocator<char> local_15c9;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  allocator<char> local_15aa;
  allocator<char> local_15a9;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  allocator<char> local_158a;
  RPCMethodImpl local_1589;
  allocator<char> local_1569;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  allocator<char> local_154a;
  allocator<char> local_1549;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  allocator<char> local_152a;
  allocator<char> local_1529;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  allocator<char> local_150a;
  allocator<char> local_1509;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  allocator<char> local_14ea;
  allocator<char> local_14e9;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  allocator<char> local_14ca;
  allocator<char> local_14c9;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  allocator<char> local_14aa;
  allocator<char> local_14a9;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  allocator<char> local_1482;
  allocator<char> local_1481 [31];
  allocator<char> local_1462;
  allocator<char> local_1461 [25];
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  allocator<char> local_142a;
  allocator<char> local_1429 [641];
  undefined1 local_11a8 [136];
  string local_1120 [4];
  undefined1 local_1098 [152];
  undefined8 local_1000;
  undefined1 local_c38 [2856];
  undefined1 local_110 [264];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1448 = 0;
  uStack_1440 = 0;
  local_1438 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(in_stack_ffffffffffffe4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_14a8 = 0;
  uStack_14a0 = 0;
  local_1498 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4a8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_14c8 = 0;
  uStack_14c0 = 0;
  local_14b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4a8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_14e8 = 0;
  uStack_14e0 = 0;
  local_14d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4a8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1508 = 0;
  uStack_1500 = 0;
  local_14f8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4a8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1528 = 0;
  uStack_1520 = 0;
  local_1518 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4a8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1548 = 0;
  uStack_1540 = 0;
  local_1538 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4a8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1568 = 0;
  uStack_1560 = 0;
  local_1558 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4a8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
                 in_stack_ffffffffffffe4f0);
  std::operator+(in_stack_ffffffffffffe4c0,(char *)in_stack_ffffffffffffe4b8);
  local_1589.super__Function_base._M_functor._1_8_ = 0;
  local_1589.super__Function_base._9_8_ = 0;
  local_1589._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4a8);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffe4a8 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe528,(Type)((ulong)in_stack_ffffffffffffe520 >> 0x20),
             in_stack_ffffffffffffe518,SUB81((ulong)in_stack_ffffffffffffe510 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffe50f,in_stack_ffffffffffffe508),
             in_stack_ffffffffffffe500,(bool)in_stack_ffffffffffffe4ff);
  fun = &local_1589;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_15a8 = 0;
  uStack_15a0 = 0;
  local_1598 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_15c8 = 0;
  uStack_15c0 = 0;
  local_15b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe528,(Type)((ulong)in_stack_ffffffffffffe520 >> 0x20),
             in_stack_ffffffffffffe518,SUB81((ulong)in_stack_ffffffffffffe510 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffe50f,in_stack_ffffffffffffe508),
             in_stack_ffffffffffffe500,(bool)in_stack_ffffffffffffe4ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
                 in_stack_ffffffffffffe4f0);
  std::operator+(in_stack_ffffffffffffe4c0,(char *)in_stack_ffffffffffffe4b8);
  local_15e8 = 0;
  uStack_15e0 = 0;
  local_15d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe528,(Type)((ulong)in_stack_ffffffffffffe520 >> 0x20),
             in_stack_ffffffffffffe518,SUB81((ulong)in_stack_ffffffffffffe510 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffe50f,in_stack_ffffffffffffe508),
             in_stack_ffffffffffffe500,(bool)in_stack_ffffffffffffe4ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
                 in_stack_ffffffffffffe4f0);
  std::operator+(in_stack_ffffffffffffe4c0,(char *)in_stack_ffffffffffffe4b8);
  local_1608 = 0;
  uStack_1600 = 0;
  local_15f8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1628 = 0;
  uStack_1620 = 0;
  local_1618 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe528,(Type)((ulong)in_stack_ffffffffffffe520 >> 0x20),
             in_stack_ffffffffffffe518,SUB81((ulong)in_stack_ffffffffffffe510 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffe50f,in_stack_ffffffffffffe508),
             in_stack_ffffffffffffe500,(bool)in_stack_ffffffffffffe4ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1648 = 0;
  uStack_1640 = 0;
  local_1638 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1668 = 0;
  uStack_1660 = 0;
  local_1658 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_16a9._1_8_ = 0;
  uStack_16a0 = 0;
  local_1698 = 0;
  this_00 = (RPCHelpMan *)(local_16a9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  description = local_1120;
  name = (string *)local_16a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_16aa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_16c9._1_8_ = 0;
  uStack_16c0 = 0;
  local_16b8 = 0;
  results = (RPCResults *)(local_16c9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  examples = (RPCExamples *)local_16c9;
  std::allocator<RPCResult>::allocator(paVar3);
  __l._M_len._0_7_ = in_stack_ffffffffffffe4f8;
  __l._M_array = (iterator)in_stack_ffffffffffffe4f0;
  __l._M_len._7_1_ = in_stack_ffffffffffffe4ff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4e8,__l,
             (allocator_type *)in_stack_ffffffffffffe4e0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_16e8 = 0;
  uStack_16e0 = 0;
  local_16d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1708._M_p = (pointer)0x0;
  sStack_1700 = 0;
  local_16f8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1728._M_p = (pointer)0x0;
  sStack_1720 = 0;
  local_1718._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  local_1748 = (pointer)0x0;
  pRStack_1740 = (pointer)0x0;
  local_1738 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe528,(Type)((ulong)in_stack_ffffffffffffe520 >> 0x20),
             in_stack_ffffffffffffe518,SUB81((ulong)in_stack_ffffffffffffe510 >> 0x38,0),
             (string *)CONCAT17(in_stack_ffffffffffffe50f,in_stack_ffffffffffffe508),
             in_stack_ffffffffffffe500,(bool)in_stack_ffffffffffffe4ff);
  RPCResult::RPCResult(in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe4f8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe4f0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe4ff;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4e8,__l_00,
             (allocator_type *)in_stack_ffffffffffffe4e0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe530,(Type)((ulong)in_stack_ffffffffffffe528 >> 0x20),
             (string *)in_stack_ffffffffffffe520,in_stack_ffffffffffffe518,in_stack_ffffffffffffe510
             ,(bool)in_stack_ffffffffffffe50f);
  RPCResults::RPCResults((RPCResults *)in_stack_ffffffffffffe528,in_stack_ffffffffffffe520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  HelpExampleCli((string *)in_stack_ffffffffffffe4e0,in_stack_ffffffffffffe4d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe4ff,in_stack_ffffffffffffe4f8),
             (char *)in_stack_ffffffffffffe4f0,(allocator<char> *)in_stack_ffffffffffffe4e8);
  HelpExampleRpc((string *)in_stack_ffffffffffffe4e0,in_stack_ffffffffffffe4d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe4e0,in_stack_ffffffffffffe4d8);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0x3b034f);
  this = (RPCResult *)local_1770;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::getwalletinfo()::__0,void>(in_stack_ffffffffffffe4b8,in_stack_ffffffffffffe4b0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_1770 + 0x23));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_174c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_174b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_174a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar4 = local_c38;
  local_1ac8 = local_110;
  do {
    local_1ac8 = local_1ac8 + -0x88;
    RPCResult::~RPCResult(this);
  } while (local_1ac8 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_172a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1729);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_1718 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1709);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_16f8 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_16e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_16cb);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_16ca);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar4 = local_11a8;
  puVar1 = local_1098;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(this);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_16aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_16a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_168a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_1689);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_166a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1669);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_164a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1649);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_162a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1629);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_160a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1609);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_15e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_15c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_15aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_15a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_158a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_1589);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1569);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_154a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1549);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_152a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1529);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_150a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1509);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_14ea);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_14e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_14ca);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_14c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_14aa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_14a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1482);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_1481);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_1462);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_1461);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe4b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_142a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_1429);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getwalletinfo()
{
    return RPCHelpMan{"getwalletinfo",
                "Returns an object containing various wallet state info.\n",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {
                        {RPCResult::Type::STR, "walletname", "the wallet name"},
                        {RPCResult::Type::NUM, "walletversion", "the wallet version"},
                        {RPCResult::Type::STR, "format", "the database format (bdb or sqlite)"},
                        {RPCResult::Type::STR_AMOUNT, "balance", "DEPRECATED. Identical to getbalances().mine.trusted"},
                        {RPCResult::Type::STR_AMOUNT, "unconfirmed_balance", "DEPRECATED. Identical to getbalances().mine.untrusted_pending"},
                        {RPCResult::Type::STR_AMOUNT, "immature_balance", "DEPRECATED. Identical to getbalances().mine.immature"},
                        {RPCResult::Type::NUM, "txcount", "the total number of transactions in the wallet"},
                        {RPCResult::Type::NUM_TIME, "keypoololdest", /*optional=*/true, "the " + UNIX_EPOCH_TIME + " of the oldest pre-generated key in the key pool. Legacy wallets only."},
                        {RPCResult::Type::NUM, "keypoolsize", "how many new keys are pre-generated (only counts external keys)"},
                        {RPCResult::Type::NUM, "keypoolsize_hd_internal", /*optional=*/true, "how many new keys are pre-generated for internal use (used for change outputs, only appears if the wallet is using this feature, otherwise external keys are used)"},
                        {RPCResult::Type::NUM_TIME, "unlocked_until", /*optional=*/true, "the " + UNIX_EPOCH_TIME + " until which the wallet is unlocked for transfers, or 0 if the wallet is locked (only present for passphrase-encrypted wallets)"},
                        {RPCResult::Type::STR_AMOUNT, "paytxfee", "the transaction fee configuration, set in " + CURRENCY_UNIT + "/kvB"},
                        {RPCResult::Type::STR_HEX, "hdseedid", /*optional=*/true, "the Hash160 of the HD seed (only present when HD is enabled)"},
                        {RPCResult::Type::BOOL, "private_keys_enabled", "false if privatekeys are disabled for this wallet (enforced watch-only wallet)"},
                        {RPCResult::Type::BOOL, "avoid_reuse", "whether this wallet tracks clean/dirty coins in terms of reuse"},
                        {RPCResult::Type::OBJ, "scanning", "current scanning details, or false if no scan is in progress",
                        {
                            {RPCResult::Type::NUM, "duration", "elapsed seconds since scan start"},
                            {RPCResult::Type::NUM, "progress", "scanning progress percentage [0.0, 1.0]"},
                        }, /*skip_type_check=*/true},
                        {RPCResult::Type::BOOL, "descriptors", "whether this wallet uses descriptors for output script management"},
                        {RPCResult::Type::BOOL, "external_signer", "whether this wallet is configured to use an external signer such as a hardware wallet"},
                        {RPCResult::Type::BOOL, "blank", "Whether this wallet intentionally does not contain any keys, scripts, or descriptors"},
                        {RPCResult::Type::NUM_TIME, "birthtime", /*optional=*/true, "The start time for blocks scanning. It could be modified by (re)importing any descriptor with an earlier timestamp."},
                        RESULT_LAST_PROCESSED_BLOCK,
                    }},
                },
                RPCExamples{
                    HelpExampleCli("getwalletinfo", "")
            + HelpExampleRpc("getwalletinfo", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    UniValue obj(UniValue::VOBJ);

    size_t kpExternalSize = pwallet->KeypoolCountExternalKeys();
    const auto bal = GetBalance(*pwallet);
    obj.pushKV("walletname", pwallet->GetName());
    obj.pushKV("walletversion", pwallet->GetVersion());
    obj.pushKV("format", pwallet->GetDatabase().Format());
    obj.pushKV("balance", ValueFromAmount(bal.m_mine_trusted));
    obj.pushKV("unconfirmed_balance", ValueFromAmount(bal.m_mine_untrusted_pending));
    obj.pushKV("immature_balance", ValueFromAmount(bal.m_mine_immature));
    obj.pushKV("txcount",       (int)pwallet->mapWallet.size());
    const auto kp_oldest = pwallet->GetOldestKeyPoolTime();
    if (kp_oldest.has_value()) {
        obj.pushKV("keypoololdest", kp_oldest.value());
    }
    obj.pushKV("keypoolsize", (int64_t)kpExternalSize);

    LegacyScriptPubKeyMan* spk_man = pwallet->GetLegacyScriptPubKeyMan();
    if (spk_man) {
        CKeyID seed_id = spk_man->GetHDChain().seed_id;
        if (!seed_id.IsNull()) {
            obj.pushKV("hdseedid", seed_id.GetHex());
        }
    }

    if (pwallet->CanSupportFeature(FEATURE_HD_SPLIT)) {
        obj.pushKV("keypoolsize_hd_internal",   (int64_t)(pwallet->GetKeyPoolSize() - kpExternalSize));
    }
    if (pwallet->IsCrypted()) {
        obj.pushKV("unlocked_until", pwallet->nRelockTime);
    }
    obj.pushKV("paytxfee", ValueFromAmount(pwallet->m_pay_tx_fee.GetFeePerK()));
    obj.pushKV("private_keys_enabled", !pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));
    obj.pushKV("avoid_reuse", pwallet->IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE));
    if (pwallet->IsScanning()) {
        UniValue scanning(UniValue::VOBJ);
        scanning.pushKV("duration", Ticks<std::chrono::seconds>(pwallet->ScanningDuration()));
        scanning.pushKV("progress", pwallet->ScanningProgress());
        obj.pushKV("scanning", std::move(scanning));
    } else {
        obj.pushKV("scanning", false);
    }
    obj.pushKV("descriptors", pwallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));
    obj.pushKV("external_signer", pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER));
    obj.pushKV("blank", pwallet->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET));
    if (int64_t birthtime = pwallet->GetBirthTime(); birthtime != UNKNOWN_TIME) {
        obj.pushKV("birthtime", birthtime);
    }

    AppendLastProcessedBlock(obj, *pwallet);
    return obj;
},
    };
}